

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O0

int saslclientio_setoption(CONCRETE_IO_HANDLE sasl_client_io,char *option_name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance;
  LOGGER_LOG l;
  int result;
  void *value_local;
  char *option_name_local;
  CONCRETE_IO_HANDLE sasl_client_io_local;
  
  if ((sasl_client_io == (CONCRETE_IO_HANDLE)0x0) || (option_name == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                ,"saslclientio_setoption",0x4d1,1,
                "Bad arguments: sasl_client_io = %p, option_name = %p",sasl_client_io,option_name);
    }
    l._4_4_ = 0x4d2;
  }
  else if (*sasl_client_io == 0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                ,"saslclientio_setoption",0x4da,1,"NULL underlying_io");
    }
    l._4_4_ = 0x4db;
  }
  else {
    iVar1 = strcmp("logtrace",option_name);
    if (iVar1 == 0) {
      *(byte *)((long)sasl_client_io + 0x78) =
           *(byte *)((long)sasl_client_io + 0x78) & 0xfe | (*value & 1) == 1;
      *(byte *)((long)sasl_client_io + 0x78) = *(byte *)((long)sasl_client_io + 0x78) & 0xfd | 2;
      l._4_4_ = 0;
    }
    else {
      iVar1 = xio_setoption(*sasl_client_io,option_name,value);
      if (iVar1 == 0) {
        l._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                    ,"saslclientio_setoption",0x4ec,1,"Error executing xio_setoption");
        }
        l._4_4_ = 0x4ed;
      }
    }
  }
  return l._4_4_;
}

Assistant:

int saslclientio_setoption(CONCRETE_IO_HANDLE sasl_client_io, const char* option_name, const void* value)
{
    int result;

    if ((sasl_client_io == NULL) ||
        (option_name == NULL))
    {
        /* Codes_SRS_SASLCLIENTIO_01_130: [ If `sasl_client_io` or `option_name` is NULL, `saslclientio_setoption`  shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: sasl_client_io = %p, option_name = %p",
            sasl_client_io, option_name);
        result = MU_FAILURE;
    }
    else
    {
        SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE*)sasl_client_io;

        if (sasl_client_io_instance->underlying_io == NULL)
        {
            LogError("NULL underlying_io");
            result = MU_FAILURE;
        }
        /* Codes_SRS_SASLCLIENTIO_01_131: [ SASL client IO shall handle the following options: ]*/
        /* Codes_SRS_SASLCLIENTIO_01_132: [ - logtrace - bool. ]*/
        else if (strcmp("logtrace", option_name) == 0)
        {
            sasl_client_io_instance->is_trace_on = *((bool*)value) == true ? 1 : 0;
            sasl_client_io_instance->is_trace_on_set = 1;

            /* Codes_SRS_SASLCLIENTIO_01_128: [ On success, `saslclientio_setoption` shall return 0. ]*/
            result = 0;
        }
        else
        {
            /* Codes_SRS_SASLCLIENTIO_03_001: [`saslclientio_setoption` shall forward all unhandled options to underlying io by calling `xio_setoption`.]*/
            if (xio_setoption(sasl_client_io_instance->underlying_io, option_name, value) != 0)
            {
                LogError("Error executing xio_setoption");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_SASLCLIENTIO_01_128: [ On success, `saslclientio_setoption` shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}